

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

ObjectSlotAttributes * __thiscall
Js::PathTypeHandlerBase::UpdateAttributes
          (PathTypeHandlerBase *this,Recycler *recycler,ObjectSlotAttributes *oldAttributes,
          uint8 oldPathSize,uint8 newTypePathSize)

{
  Recycler *this_00;
  ObjectSlotAttributes *__dest;
  uint uVar1;
  undefined7 in_register_00000009;
  ulong count;
  undefined3 in_register_00000081;
  uint8 i;
  ulong __n;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  data._36_4_ = SUB84(CONCAT71(in_register_00000009,oldPathSize),0);
  count = (ulong)CONCAT31(in_register_00000081,newTypePathSize);
  local_60 = (undefined1  [8])&ObjectSlotAttributes::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_9af3a56;
  data.filename._0_4_ = 0x8ea;
  data.plusSize = count;
  this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
  __n = 0;
  __dest = Memory::AllocateArray<Memory::Recycler,Js::ObjectSlotAttributes,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
  if (oldAttributes != (ObjectSlotAttributes *)0x0) {
    uVar1 = data._36_4_ & 0xff;
    if (newTypePathSize < (byte)data._36_1_) {
      uVar1 = (uint)newTypePathSize;
    }
    __n = (ulong)uVar1;
    memcpy(__dest,oldAttributes,__n);
  }
  for (; __n < count; __n = __n + 1) {
    __dest[__n] = ObjectSlotAttr_Default;
  }
  return __dest;
}

Assistant:

ObjectSlotAttributes * PathTypeHandlerBase::UpdateAttributes(Recycler * recycler, ObjectSlotAttributes * oldAttributes, uint8 oldPathSize, uint8 newTypePathSize)
    {
        ObjectSlotAttributes * newAttributes = RecyclerNewArrayLeaf(recycler, ObjectSlotAttributes, newTypePathSize);
        uint8 initStart;
        if (oldAttributes == nullptr)
        {
            initStart = 0;
        }
        else
        {
            // In branching cases, the new type path may be shorter than the old.
            initStart = min(newTypePathSize, oldPathSize);
            memcpy(newAttributes, oldAttributes, sizeof(ObjectSlotAttributes) * initStart);
        }
        for (uint8 i = initStart; i < newTypePathSize; i++)
        {
            newAttributes[i] = ObjectSlotAttr_Default;
        }

        return newAttributes;
    }